

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxinternal.c
# Opt level: O2

WebPMuxImage * MuxImageRelease(WebPMuxImage *wpi)

{
  WebPMuxImage *pWVar1;
  
  if (wpi != (WebPMuxImage *)0x0) {
    ChunkListDelete(&wpi->header);
    ChunkListDelete(&wpi->alpha);
    ChunkListDelete(&wpi->img);
    ChunkListDelete(&wpi->unknown);
    pWVar1 = wpi->next;
    wpi->header = (WebPChunk *)0x0;
    wpi->alpha = (WebPChunk *)0x0;
    wpi->img = (WebPChunk *)0x0;
    wpi->unknown = (WebPChunk *)0x0;
    wpi->width = 0;
    wpi->height = 0;
    wpi->has_alpha = 0;
    wpi->is_partial = 0;
    wpi->next = (WebPMuxImage *)0x0;
    return pWVar1;
  }
  return (WebPMuxImage *)0x0;
}

Assistant:

WebPMuxImage* MuxImageRelease(WebPMuxImage* const wpi) {
  WebPMuxImage* next;
  if (wpi == NULL) return NULL;
  // There should be at most one chunk of 'header', 'alpha', 'img' but we call
  // ChunkListDelete to be safe
  ChunkListDelete(&wpi->header);
  ChunkListDelete(&wpi->alpha);
  ChunkListDelete(&wpi->img);
  ChunkListDelete(&wpi->unknown);

  next = wpi->next;
  MuxImageInit(wpi);
  return next;
}